

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GridDataType1::GridDataType1
          (GridDataType1 *this,KUINT16 SampleType,KUINT16 DataRepresentation,KDataStream *stream)

{
  KUINT16 *T;
  iterator __position;
  ushort uVar1;
  ulong in_RAX;
  ushort uVar2;
  KUINT16 tmp;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType1_00224830;
  (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = DataRepresentation;
  KDataStream::Read<float>(stream,(float *)&(this->super_GridData).field_0xc);
  KDataStream::Read<float>(stream,(float *)&this->m_f32FieldOffset);
  T = &this->m_ui16NumValues;
  KDataStream::Read<unsigned_short>(stream,T);
  uStack_38 = uStack_38 & 0xffffffffffff;
  uVar1 = *T;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      KDataStream::Read<unsigned_short>(stream,(unsigned_short *)((long)&uStack_38 + 6));
      __position._M_current =
           (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vui16Values,
                   __position,(unsigned_short *)((long)&uStack_38 + 6));
      }
      else {
        *__position._M_current = uStack_38._6_2_;
        (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = uVar2 + 1;
      uVar1 = *T;
    } while (uVar2 < uVar1);
  }
  if ((uVar1 & 1) != 0) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
  }
  return;
}

Assistant:

GridDataType1::GridDataType1( KUINT16 SampleType, KUINT16 DataRepresentation, KDataStream & stream )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = DataRepresentation;
    stream >> m_f32FieldScale
           >> m_f32FieldOffset
           >> m_ui16NumValues;

    KUINT16 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vui16Values.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumValues % 2 == 1 )
    {
        stream >> m_ui16Padding;
    }
}